

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_example_json.h
# Opt level: O0

BaseState<false> * __thiscall
MultiState<false>::StartArray(MultiState<false> *this,Context<false> *ctx)

{
  uint64_t uVar1;
  undefined8 uVar2;
  long in_RSI;
  v_array<CB::cb_class> *in_RDI;
  stringstream __msg;
  cb_class f;
  label *ld;
  cb_class *in_stack_fffffffffffffe08;
  string *in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe34;
  char *in_stack_fffffffffffffe38;
  vw_exception *in_stack_fffffffffffffe40;
  size_t in_stack_fffffffffffffe48;
  void *in_stack_fffffffffffffe50;
  ostream local_1a0;
  undefined4 local_28;
  undefined4 local_24;
  undefined4 local_20;
  undefined4 local_1c;
  long local_18;
  
  if (*(int *)(*(long *)(in_RSI + 8) + 0x3650) == 1) {
    local_18 = *(long *)(in_RSI + 0x50) + 0x6828;
    local_1c = 0;
    uVar1 = uniform_hash(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
                         (uint64_t)in_stack_fffffffffffffe40);
    local_24 = (undefined4)uVar1;
    local_28 = 0x7f7fffff;
    local_20 = 0xbf800000;
    v_array<CB::cb_class>::push_back(in_RDI,in_stack_fffffffffffffe08);
    return (BaseState<false> *)in_RDI;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&stack0xfffffffffffffe50);
  std::operator<<(&local_1a0,"label type is not CB");
  uVar2 = __cxa_allocate_exception(0x38);
  std::__cxx11::stringstream::str();
  VW::vw_exception::vw_exception
            (in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,in_stack_fffffffffffffe34,
             in_stack_fffffffffffffe28);
  __cxa_throw(uVar2,&VW::vw_exception::typeinfo,VW::vw_exception::~vw_exception);
}

Assistant:

BaseState<audit>* StartArray(Context<audit>& ctx)
  {
    // mark shared example
    if (ctx.all->label_type == label_type::cb)
    {
      CB::label* ld = &ctx.ex->l.cb;
      CB::cb_class f;

      f.partial_prediction = 0.;
      f.action = (uint32_t)uniform_hash("shared", 6, 0);
      f.cost = FLT_MAX;
      f.probability = -1.f;

      ld->costs.push_back(f);
    }
    else
      THROW("label type is not CB")

    return this;
  }